

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.cpp
# Opt level: O1

void __thiscall cppcms::filters::strftime::operator()(strftime *this,ostream *out)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *psVar2;
  ulong uVar3;
  set_timezone tz;
  ostringstream ss;
  add_ftime<char> local_1b8;
  long local_198 [14];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  std::ios::copyfmt((ios *)((ostringstream *)local_198 + *(long *)(local_198[0] + -0x18)));
  if ((this->tz_)._M_string_length != 0) {
    paVar1 = &local_1b8.ftime.field_2;
    local_1b8.ftime._M_string_length = 0;
    local_1b8.ftime.field_2._M_local_buf[0] = '\0';
    local_1b8.ftime._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_assign((string *)&local_1b8);
    psVar2 = (string *)
             booster::locale::ios_info::get
                       ((ios_base *)((ostringstream *)local_198 + *(long *)(local_198[0] + -0x18)));
    booster::locale::ios_info::time_zone(psVar2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8.ftime._M_dataplus._M_p != paVar1) {
      operator_delete(local_1b8.ftime._M_dataplus._M_p);
    }
  }
  uVar3 = booster::locale::ios_info::get
                    ((ios_base *)((ostringstream *)local_198 + *(long *)(local_198[0] + -0x18)));
  booster::locale::ios_info::display_flags(uVar3);
  booster::locale::as::ftime<char>(&local_1b8,&this->format_);
  booster::locale::as::details::add_ftime<char>::apply
            (&local_1b8,
             (basic_ios<char,_std::char_traits<char>_> *)
             ((ostringstream *)local_198 + *(long *)(local_198[0] + -0x18)));
  paVar1 = &local_1b8.ftime.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8.ftime._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8.ftime._M_dataplus._M_p);
  }
  (*(this->time_).to_stream_)((ostream *)local_198,(this->time_).ptr_);
  std::__cxx11::stringbuf::str();
  std::__ostream_insert<char,std::char_traits<char>>
            (out,local_1b8.ftime._M_dataplus._M_p,local_1b8.ftime._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8.ftime._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8.ftime._M_dataplus._M_p);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base(local_128);
  return;
}

Assistant:

void strftime::operator()(std::ostream &out) const
	{
		std::ostringstream ss;
		ss.copyfmt(out);
		if(!tz_.empty())
			ss << cppcms::locale::as::time_zone(tz_);
		ss << cppcms::locale::as::datetime << cppcms::locale::as::ftime(format_);
		time_(ss);
		out << ss.str();
	}